

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Graph *g)

{
  bool bVar1;
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  *this_00;
  reference ppVar2;
  EndpointDeclaration *endpoint;
  VariableDeclaration *pVVar3;
  GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
  local_b8;
  CompileMessage local_a0;
  reference local_68;
  pool_ref<soul::AST::VariableDeclaration> *v;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2_1;
  pool_ref<soul::AST::EndpointDeclaration> local_38;
  pool_ref<soul::AST::EndpointDeclaration> input;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  *__range2;
  Graph *g_local;
  PostResolutionChecks *this_local;
  
  ASTVisitor::visit(&this->super_ASTVisitor,g);
  this_00 = &(g->super_ProcessorBase).endpoints;
  __end2 = std::
           vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
           ::begin(this_00);
  input.object = (EndpointDeclaration *)
                 std::
                 vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
                 ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::EndpointDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>_>
                                *)&input);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::EndpointDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>_>
             ::operator*(&__end2);
    local_38.object = ppVar2->object;
    endpoint = pool_ref<soul::AST::EndpointDeclaration>::get(&local_38);
    checkEndpointDataTypes(endpoint);
    pool_ref<soul::AST::EndpointDeclaration>::~pool_ref(&local_38);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::EndpointDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             ::begin(&g->constants);
  v = (pool_ref<soul::AST::VariableDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ::end(&g->constants);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                        *)&v);
    if (!bVar1) {
      RecursiveGraphDetector::check(g,(RecursiveGraphDetector *)0x0);
      visit(soul::AST::Graph&)::CycleDetector::CycleDetector(soul::AST::Graph__(&local_b8,g);
      heart::Utilities::
      GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
      ::checkAndThrowErrorIfCycleFound(&local_b8);
      visit::CycleDetector::~CycleDetector((CycleDetector *)&local_b8);
      return;
    }
    local_68 = __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
               ::operator*(&__end2_1);
    pVVar3 = pool_ref<soul::AST::VariableDeclaration>::operator->(local_68);
    bVar1 = AST::VariableDeclaration::isCompileTimeConstant(pVVar3);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2_1);
  }
  pVVar3 = pool_ref<soul::AST::VariableDeclaration>::operator->(local_68);
  Errors::nonConstInGraph<>();
  AST::Context::throwError(&(pVVar3->super_Statement).super_ASTObject.context,&local_a0,false);
}

Assistant:

void visit (AST::Graph& g) override
        {
            super::visit (g);

            for (auto input : g.endpoints)
                checkEndpointDataTypes (input.get());

            for (auto& v : g.constants)
                if (! v->isCompileTimeConstant())
                    v->context.throwError (Errors::nonConstInGraph());

            RecursiveGraphDetector::check (g);

            struct CycleDetector  : public heart::Utilities::GraphTraversalHelper<CycleDetector, AST::ProcessorInstance, AST::Connection, AST::Context>
            {
                CycleDetector (AST::Graph& graph)
                {
                    reserve (graph.processorInstances.size());

                    for (auto& p : graph.processorInstances)
                        addNode (p);

                    for (auto& c : graph.connections)
                        if (c->delayLength == nullptr)
                            if (auto src = c->getSourceProcessor())
                                if (auto dst = c->getDestProcessor())
                                    addConnection (*src, *dst, c);
                }

                static std::string getProcessorName (const AST::ProcessorInstance& p)  { return p.getReadableName(); }
                static const AST::Context& getContext (const AST::Connection& c)       { return c.context; }
            };

            CycleDetector (g).checkAndThrowErrorIfCycleFound();
        }